

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.h
# Opt level: O3

bool CoreML::Specification::operator==(TextClassifier *a,TextClassifier *b)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  
  if (a->revision_ != b->revision_) {
    return false;
  }
  puVar4 = (undefined8 *)((ulong)(a->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  puVar5 = (undefined8 *)((ulong)(b->language_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  sVar1 = puVar4[1];
  if ((sVar1 == puVar5[1]) &&
     ((((sVar1 == 0 || (iVar3 = bcmp((void *)*puVar4,(void *)*puVar5,sVar1), iVar3 == 0)) &&
       (a->_oneof_case_[0] == b->_oneof_case_[0])) &&
      ((a->_oneof_case_[0] != 200 ||
       (bVar2 = vectorsEqual<CoreML::Specification::StringVector>
                          ((a->ClassLabels_).stringclasslabels_,(b->ClassLabels_).stringclasslabels_
                          ), bVar2)))))) {
    puVar4 = (undefined8 *)((ulong)(a->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    sVar1 = puVar4[1];
    puVar5 = (undefined8 *)((ulong)(b->modelparameterdata_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    if ((sVar1 == puVar5[1]) &&
       ((sVar1 == 0 || (iVar3 = bcmp((void *)*puVar4,(void *)*puVar5,sVar1), iVar3 == 0)))) {
      return true;
    }
  }
  return false;
}

Assistant:

inline uint32_t TextClassifier::_internal_revision() const {
  return revision_;
}